

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.hpp
# Opt level: O2

size_t __thiscall webfront::fs::File::readData(File *this,span<char,_18446744073709551615UL> buffer)

{
  ulong uVar1;
  __extent_storage<18446744073709551615UL> _Var2;
  size_t index;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  UIntByte chunk;
  
  chunk.uInt = 0;
  sVar3 = 0;
  while ((_Var2._M_extent_value = buffer._M_extent._M_extent_value._M_extent_value,
         buffer._M_extent._M_extent_value._M_extent_value != sVar3 &&
         (_Var2._M_extent_value = sVar3, this->eofBit == false))) {
    uVar4 = this->readIndex & 7;
    if (uVar4 == 0) {
      uVar1 = *(ulong *)((long)(this->data)._M_ptr + this->readIndex);
      chunk.uInt = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                   (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                   (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28
                   | uVar1 << 0x38;
    }
    buffer._M_ptr[sVar3] = chunk.byte[uVar4];
    sVar5 = this->readIndex + 1;
    this->readIndex = sVar5;
    if (sVar5 == this->size) {
      this->eofBit = true;
    }
    sVar3 = sVar3 + 1;
  }
  return _Var2._M_extent_value;
}

Assistant:

size_t readData(std::span<char> buffer) {
        constexpr auto bytesPerInt = sizeof(decltype(data)::value_type);
        UIntByte chunk{};
        for (size_t index = 0; (index < buffer.size()); ++index) {
            if (eof()) return index;

            if (readIndex % bytesPerInt == 0) chunk = convert(data[readIndex / bytesPerInt]);

            buffer[index] = static_cast<char>(chunk.byte[readIndex % bytesPerInt]);
            readIndex++;
            if (readIndex == size) eofBit = true;
        }
        return buffer.size();
    }